

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_fill_unique(lys_module *module,lys_node_list *list,lys_unique *unique,char *value,
                    unres_schema *unres)

{
  ushort *puVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  char **ppcVar6;
  char *pcVar7;
  undefined8 *item;
  LY_ERR *pLVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t uVar11;
  
  pcVar4 = strpbrk(value," \t\n");
  if (pcVar4 != (char *)0x0) {
    ppuVar5 = __ctype_b_loc();
    puVar1 = *ppuVar5;
    uVar11 = unique->expr_size;
    do {
      uVar11 = uVar11 + '\x01';
      unique->expr_size = uVar11;
      pcVar4 = pcVar4 + -1;
      do {
        pcVar7 = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
      } while ((*(byte *)((long)puVar1 + (long)*pcVar7 * 2 + 1) & 0x20) != 0);
      pcVar4 = strpbrk(pcVar4," \t\n");
    } while (pcVar4 != (char *)0x0);
  }
  bVar2 = unique->expr_size + 1;
  unique->expr_size = bVar2;
  ppcVar6 = (char **)calloc((ulong)bVar2,8);
  unique->expr = ppcVar6;
  if (ppcVar6 == (char **)0x0) {
    pLVar8 = ly_errno_location();
    *pLVar8 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_fill_unique");
LAB_0014d028:
    iVar3 = 1;
  }
  else {
    if (unique->expr_size != '\0') {
      uVar10 = 0;
      do {
        pcVar4 = strpbrk(value," \t\n");
        if (pcVar4 == (char *)0x0) {
          pcVar4 = value;
        }
        pcVar7 = lydict_insert(module->ctx,value,(long)pcVar4 - (long)value);
        unique->expr[uVar10] = pcVar7;
        if (uVar10 != 0) {
          pcVar7 = unique->expr[uVar10];
          uVar9 = 0;
          do {
            if (unique->expr[uVar9] == pcVar7) {
              ly_vlog(LYE_INARG,LY_VLOG_LYS,list,pcVar7,"unique");
              ly_vlog(LYE_SPEC,LY_VLOG_LYS,list,"The identifier is not unique");
              goto LAB_0014d028;
            }
            uVar9 = uVar9 + 1;
          } while (uVar10 != uVar9);
        }
        if (unres == (unres_schema *)0x0) {
          iVar3 = resolve_unique((lys_node *)list,unique->expr[uVar10],&unique->trg_type);
          if (iVar3 != 0) goto LAB_0014d028;
        }
        else {
          item = (undefined8 *)malloc(0x18);
          *item = list;
          item[1] = unique->expr[uVar10];
          item[2] = &unique->trg_type;
          iVar3 = unres_schema_add_node(module,unres,item,UNRES_LIST_UNIQ,(lys_node *)0x0);
          if (iVar3 == -1) goto LAB_0014d028;
        }
        ppuVar5 = __ctype_b_loc();
        value = pcVar4 + -1;
        do {
          pcVar4 = value + 1;
          value = value + 1;
        } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
        uVar10 = uVar10 + 1;
      } while (uVar10 < unique->expr_size);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
yang_fill_unique(struct lys_module *module, struct lys_node_list *list, struct lys_unique *unique, char *value, struct unres_schema *unres)
{
    int i, j;
    char *vaux;
    struct unres_list_uniq *unique_info;

    /* count the number of unique leafs in the value */
    vaux = value;
    while ((vaux = strpbrk(vaux, " \t\n"))) {
       unique->expr_size++;
        while (isspace(*vaux)) {
            vaux++;
        }
    }
    unique->expr_size++;
    unique->expr = calloc(unique->expr_size, sizeof *unique->expr);
    if (!unique->expr) {
        LOGMEM;
        goto error;
    }

    for (i = 0; i < unique->expr_size; i++) {
        vaux = strpbrk(value, " \t\n");
        if (!vaux) {
            /* the last token, lydict_insert() will count its size on its own */
            vaux = value;
        }

        /* store token into unique structure */
        unique->expr[i] = lydict_insert(module->ctx, value, vaux - value);

        /* check that the expression does not repeat */
        for (j = 0; j < i; j++) {
            if (ly_strequal(unique->expr[j], unique->expr[i], 1)) {
                LOGVAL(LYE_INARG, LY_VLOG_LYS, list, unique->expr[i], "unique");
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, list, "The identifier is not unique");
                goto error;
            }
        }
        /* try to resolve leaf */
        if (unres) {
            unique_info = malloc(sizeof *unique_info);
            unique_info->list = (struct lys_node *)list;
            unique_info->expr = unique->expr[i];
            unique_info->trg_type = &unique->trg_type;
            if (unres_schema_add_node(module, unres, unique_info, UNRES_LIST_UNIQ, NULL) == -1) {
                goto error;
            }
        } else {
            if (resolve_unique((struct lys_node *)list, unique->expr[i], &unique->trg_type)) {
                goto error;
            }
        }

        /* move to next token */
        value = vaux;
        while(isspace(*value)) {
            value++;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}